

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

void __thiscall cfd::core::Pubkey::Pubkey(Pubkey *this,string *hex_string)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  ByteData::ByteData((ByteData *)&_Stack_28,hex_string);
  Pubkey(this,(ByteData *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

Pubkey::Pubkey(const std::string &hex_string) : Pubkey(ByteData(hex_string)) {
  // do nothing
}